

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

AActor * P_SpawnMissileZAimed(AActor *source,double z,AActor *dest,PClassActor *type)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  double dVar5;
  double vz;
  double speed;
  double local_50;
  DAngle local_38;
  
  if (type == (PClassActor *)0x0 || source == (AActor *)0x0) {
    return (AActor *)0x0;
  }
  local_50 = (source->Angles).Yaw.Degrees;
  if (((dest->flags).Value & 0x40000) != 0) {
    uVar1 = FRandom::GenRand32(&pr_spawnmissile);
    uVar2 = FRandom::GenRand32(&pr_spawnmissile);
    local_50 = local_50 + (double)(int)((uVar1 & 0xff) - (uVar2 & 0xff)) * 0.044444444444444446;
  }
  dVar5 = AActor::Distance2D(source,dest,false);
  iVar3 = G_SkillProperty(SKILLP_FastMonsters);
  if ((iVar3 == 0) || (speed = type->FastSpeed, speed < 0.0)) {
    speed = *(double *)((type->super_PClass).Defaults + 0xe0);
  }
  dVar5 = dVar5 / speed;
  if ((dVar5 != 0.0) || (vz = speed, NAN(dVar5))) {
    vz = ((dest->__Pos).Z - (source->__Pos).Z) / dVar5;
  }
  local_38.Degrees = local_50;
  pAVar4 = P_SpawnMissileAngleZSpeed(source,z,type,&local_38,vz,speed,(AActor *)0x0,true);
  return pAVar4;
}

Assistant:

AActor *P_SpawnMissileZAimed (AActor *source, double z, AActor *dest, PClassActor *type)
{
	if (source == nullptr || type == nullptr)
	{
		return nullptr;
	}
	DAngle an;
	double dist;
	double speed;
	double vz;

	an = source->Angles.Yaw;

	if (dest->flags & MF_SHADOW)
	{
		an += pr_spawnmissile.Random2() * (16. / 360.);
	}
	dist = source->Distance2D (dest);
	speed = GetDefaultSpeed (type);
	dist /= speed;
	vz = dist != 0 ? (dest->Z() - source->Z())/dist : speed;
	return P_SpawnMissileAngleZSpeed (source, z, type, an, vz, speed);
}